

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O3

string * __thiscall
duckdb::BatchedDataCollection::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BatchedDataCollection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong __val;
  bool bVar2;
  char cVar3;
  long *plVar4;
  pointer this_00;
  _Base_ptr p_Var5;
  ulong uVar6;
  size_type *psVar7;
  long *plVar8;
  char cVar9;
  _Rb_tree_header *p_Var10;
  string __str;
  long *local_98;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string local_70;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  p_Var5 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(this->data)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var10) {
    do {
      __val = *(ulong *)(p_Var5 + 1);
      cVar9 = '\x01';
      if (9 < __val) {
        uVar6 = __val;
        cVar3 = '\x04';
        do {
          cVar9 = cVar3;
          if (uVar6 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_00d9e0c6;
          }
          if (uVar6 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_00d9e0c6;
          }
          if (uVar6 < 10000) goto LAB_00d9e0c6;
          bVar2 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar3 = cVar9 + '\x04';
        } while (bVar2);
        cVar9 = cVar9 + '\x01';
      }
LAB_00d9e0c6:
      local_50 = local_40;
      ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar9);
      ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,__val);
      plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1db4fba);
      paVar1 = &local_70.field_2;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_70.field_2._M_allocated_capacity = *psVar7;
        local_70.field_2._8_8_ = plVar4[3];
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar7;
        local_70._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_70._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_70);
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_88 = *plVar8;
        lStack_80 = plVar4[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar8;
        local_98 = (long *)*plVar4;
      }
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                              *)&p_Var5[1]._M_parent);
      ColumnDataCollection::ToString_abi_cxx11_(&local_70,this_00);
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_70);
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_88 = *plVar8;
        lStack_80 = plVar4[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar8;
        local_98 = (long *)*plVar4;
      }
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var10);
  }
  return __return_storage_ptr__;
}

Assistant:

string BatchedDataCollection::ToString() const {
	string result;
	result += "Batched Data Collection\n";
	for (auto &entry : data) {
		result += "Batch Index - " + to_string(entry.first) + "\n";
		result += entry.second->ToString() + "\n\n";
	}
	return result;
}